

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles3::Performance::anon_unknown_0::BaseCase::iterate(BaseCase *this)

{
  TextureFormat *pTVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ChannelType CVar3;
  TestLog *log;
  RenderContext *context;
  TextureFormat TVar4;
  int iVar5;
  deUint32 dVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  ObjectTraits *pOVar9;
  RenderData *pRVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar11;
  TextureFormat *pTVar12;
  SampleBuilder *pSVar13;
  TestError *this_00;
  LogValueInfo *access;
  void *__buf;
  TextureFormat *pTVar14;
  int step;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  size_t __n;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
  results;
  vector<int,_std::allocator<int>_> params;
  size_type __dnew_3;
  size_type __dnew;
  RenderDataP occludedData;
  RenderDataP occluderData;
  int workload;
  size_type __dnew_2;
  Renderbuffer depthbuffer;
  Renderbuffer renderbuffer;
  size_type __dnew_1;
  Framebuffer framebuffer;
  TextureLevel resultTex;
  Random rng;
  TextureFormat *local_658;
  TextureFormat *pTStack_650;
  TextureFormat *local_648;
  RenderData *local_640;
  vector<int,_std::allocator<int>_> local_638;
  LogValueInfo local_618;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  LogValueInfo local_530;
  UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  local_4c8;
  string local_4b8;
  string local_498;
  string local_478;
  UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  local_458;
  undefined1 local_448 [8];
  undefined1 auStack_440 [16];
  ChannelOrder CStack_430;
  ChannelType CStack_42c;
  undefined1 local_428 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  qpSampleValueTag local_3e8;
  ios_base local_3d0 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  pointer local_378;
  pointer local_368;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  LogValueInfo local_248;
  RenderData *local_1e0;
  string local_1d8;
  string local_1b8;
  string local_198;
  ObjectWrapper local_178;
  ObjectWrapper local_160;
  LogValueInfo local_148;
  string local_e0;
  string local_c0;
  string local_a0;
  ObjectWrapper local_80;
  TextureLevel local_68;
  deRandom local_40;
  Functions *gl;
  
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  pOVar9 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_80,gl,pOVar9);
  pOVar9 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_160,gl,pOVar9);
  pOVar9 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_178,gl,pOVar9);
  local_658 = (TextureFormat *)0x0;
  pTStack_650 = (TextureFormat *)0x0;
  local_648 = (TextureFormat *)0x0;
  local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_458.m_data.ptr = (RenderData *)0x0;
  local_4c8.m_data.ptr = (RenderData *)0x0;
  local_448._0_4_ = RGBA;
  local_448._4_4_ = UNORM_INT8;
  tcu::TextureLevel::TextureLevel(&local_68,(TextureFormat *)local_448,0x200,0x200,1);
  dVar6 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  uVar7 = tcu::CommandLine::getBaseSeed
                    (((this->super_TestCase).super_TestNode.m_testCtx)->m_cmdLine);
  uVar17 = (dVar6 >> 0x10 ^ dVar6 ^ 0x3d) * 9;
  uVar17 = (uVar17 >> 4 ^ uVar17) * 0x27d4eb2d;
  deRandom_init(&local_40,uVar17 >> 0xf ^ uVar7 ^ uVar17);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[6])(this);
  (*gl->bindRenderbuffer)(0x8d41,local_160.m_object);
  (*gl->renderbufferStorage)(0x8d41,0x8058,0x200,0x200);
  (*gl->bindRenderbuffer)(0x8d41,local_178.m_object);
  (*gl->renderbufferStorage)(0x8d41,0x88f0,0x200,0x200);
  (*gl->bindFramebuffer)(0x8d40,local_80.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,local_160.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,local_178.m_object);
  (*gl->viewport)(0,0,0x200,0x200);
  (*gl->clearColor)(0.125,0.25,0.5,1.0);
  iVar5 = (*(this->super_TestCase).super_TestNode._vptr_TestNode[9])();
  pRVar10 = (RenderData *)operator_new(0x108);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])(local_448,this);
  RenderData::RenderData(pRVar10,(ObjectData *)local_448,this->m_renderCtx,log);
  local_248.m_name._M_dataplus._M_p = (pointer)0x0;
  de::details::
  UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::reset(&local_458);
  local_458.m_data.ptr = pRVar10;
  de::details::
  UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::reset((UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
           *)&local_248);
  if (local_378 != (pointer)0x0) {
    operator_delete(local_378,(long)local_368 - (long)local_378);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_398);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_3b8);
  lVar15 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_448 + lVar15));
    lVar15 = lVar15 + -0x18;
  } while (lVar15 != -0x18);
  pRVar10 = (RenderData *)operator_new(0x108);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[8])(local_448,this);
  RenderData::RenderData(pRVar10,(ObjectData *)local_448,this->m_renderCtx,log);
  local_248.m_name._M_dataplus._M_p = (pointer)0x0;
  if (local_4c8.m_data.ptr != pRVar10) {
    de::details::
    UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
    ::reset(&local_4c8);
    local_4c8.m_data.ptr = pRVar10;
  }
  de::details::
  UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
  ::reset((UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
           *)&local_248);
  if (local_378 != (pointer)0x0) {
    operator_delete(local_378,(long)local_368 - (long)local_378);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_398);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_3b8);
  lVar15 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_448 + lVar15));
    pRVar10 = local_458.m_data.ptr;
    lVar15 = lVar15 + -0x18;
  } while (lVar15 != -0x18);
  if (((local_458.m_data.ptr)->m_program).m_program.m_info.linkOk == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"occluderData->m_program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pDepthTests.cpp"
               ,0x243);
  }
  else {
    local_640 = local_4c8.m_data.ptr;
    if (((local_4c8.m_data.ptr)->m_program).m_program.m_info.linkOk != false) {
      (*gl->clear)(0x4500);
      (*gl->enable)(0xb71);
      iVar8 = (*this->m_renderCtx->_vptr_RenderContext[3])();
      lVar15 = CONCAT44(extraout_var_00,iVar8);
      (**(code **)(lVar15 + 0x1680))((pRVar10->m_program).m_program.m_program);
      (**(code **)(lVar15 + 0xd8))((pRVar10->m_vao).super_ObjectWrapper.m_object);
      (**(code **)(lVar15 + 0x538))(4,0,pRVar10->m_numVertices);
      (**(code **)(lVar15 + 0xd8))(0);
      iVar8 = (*this->m_renderCtx->_vptr_RenderContext[3])();
      lVar15 = CONCAT44(extraout_var_01,iVar8);
      (**(code **)(lVar15 + 0x1680))((local_640->m_program).m_program.m_program);
      (**(code **)(lVar15 + 0xd8))((local_640->m_vao).super_ObjectWrapper.m_object);
      (**(code **)(lVar15 + 0x538))(4,0,local_640->m_numVertices);
      (**(code **)(lVar15 + 0xd8))(0);
      context = this->m_renderCtx;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_448,&local_68);
      glu::readPixels(context,0,0,(PixelBufferAccess *)local_448);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_248,&local_68);
      TVar4 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      local_618.m_name._M_dataplus._M_p = (pointer)&local_618.m_name.field_2;
      local_618.m_name.field_2._M_allocated_capacity._0_5_ = 0x656d6f6547;
      local_618.m_name._M_string_length = 8;
      local_618.m_name.field_2._5_4_ = 0x797274;
      paVar2 = &local_530.m_name.field_2;
      local_530.m_name.field_2._M_allocated_capacity._0_5_ = 0x656d6f6547;
      local_530.m_name._M_string_length = 8;
      local_530.m_name.field_2._5_4_ = 0x797274;
      local_530.m_name._M_dataplus._M_p = (pointer)paVar2;
      tcu::LogSection::LogSection((LogSection *)local_448,&local_618.m_name,&local_530.m_name);
      tcu::TestLog::startSection((TestLog *)TVar4,(char *)local_448,(char *)local_428._0_8_);
      if ((pointer)local_428._0_8_ != (pointer)(local_428 + 0x10)) {
        operator_delete((void *)local_428._0_8_,(ulong)(local_428._16_8_ + 1));
      }
      if (local_448 != (undefined1  [8])((long)auStack_440 + 8)) {
        operator_delete((void *)local_448,auStack_440._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530.m_name._M_dataplus._M_p != paVar2) {
        operator_delete(local_530.m_name._M_dataplus._M_p,
                        CONCAT35(local_530.m_name.field_2._M_allocated_capacity._5_3_,
                                 local_530.m_name.field_2._M_allocated_capacity._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618.m_name._M_dataplus._M_p != &local_618.m_name.field_2) {
        operator_delete(local_618.m_name._M_dataplus._M_p,
                        CONCAT35(local_618.m_name.field_2._M_allocated_capacity._5_3_,
                                 local_618.m_name.field_2._M_allocated_capacity._0_5_) + 1);
      }
      local_448 = (undefined1  [8])TVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_440,
                 "Occluding geometry is green with shade dependent on depth (rgb == 0, depth, 0)",
                 0x4e);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_440);
      std::ios_base::~ios_base(local_3d0);
      local_448 = (undefined1  [8])TVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_440);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_440,
                 "Occluded geometry is red with shade dependent on depth (rgb == depth, 0, 0)",0x4b)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_440);
      std::ios_base::~ios_base(local_3d0);
      local_448 = (undefined1  [8])TVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_440);
      paVar2 = &local_530.m_name.field_2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_440,"Primitive edges are a lighter shade of red/green",0x30);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_440);
      std::ios_base::~ios_base(local_3d0);
      local_618.m_name._M_dataplus._M_p = (pointer)&local_618.m_name.field_2;
      local_618.m_name.field_2._M_allocated_capacity._0_5_ = 0x2074736554;
      local_618.m_name.field_2._5_4_ = 0x6d6f6547;
      local_618.m_name.field_2._9_4_ = 0x79727465;
      local_618.m_name._M_string_length = 0xd;
      local_618.m_name.field_2._M_local_buf[0xd] = '\0';
      local_530.m_name.field_2._M_allocated_capacity._0_5_ = 0x2074736554;
      local_530.m_name.field_2._5_4_ = 0x6d6f6547;
      local_530.m_name.field_2._9_4_ = 0x79727465;
      local_530.m_name._M_string_length = 0xd;
      local_530.m_name.field_2._M_local_buf[0xd] = '\0';
      access = &local_248;
      local_530.m_name._M_dataplus._M_p = (pointer)paVar2;
      tcu::LogImage::LogImage
                ((LogImage *)local_448,&local_618.m_name,&local_530.m_name,
                 (ConstPixelBufferAccess *)access,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_448,TVar4.order,__buf,(size_t)access);
      if ((pointer)local_428._0_8_ != (pointer)(local_428 + 0x10)) {
        operator_delete((void *)local_428._0_8_,(ulong)(local_428._16_8_ + 1));
      }
      if (local_448 != (undefined1  [8])((long)auStack_440 + 8)) {
        operator_delete((void *)local_448,auStack_440._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530.m_name._M_dataplus._M_p != paVar2) {
        operator_delete(local_530.m_name._M_dataplus._M_p,
                        CONCAT35(local_530.m_name.field_2._M_allocated_capacity._5_3_,
                                 local_530.m_name.field_2._M_allocated_capacity._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618.m_name._M_dataplus._M_p != &local_618.m_name.field_2) {
        operator_delete(local_618.m_name._M_dataplus._M_p,
                        CONCAT35(local_618.m_name.field_2._M_allocated_capacity._5_3_,
                                 local_618.m_name.field_2._M_allocated_capacity._0_5_) + 1);
      }
      tcu::TestLog::endSection((TestLog *)TVar4);
      local_618.m_name._M_dataplus._M_p = (pointer)&local_618.m_name.field_2;
      local_618.m_name.field_2._M_allocated_capacity._0_5_ = 0x756c63634f;
      local_618.m_name._M_string_length = 8;
      local_618.m_name.field_2._5_4_ = 0x726564;
      local_530.m_name.field_2._M_allocated_capacity._0_5_ = 0x756c63634f;
      local_530.m_name._M_string_length = 8;
      local_530.m_name.field_2._5_4_ = 0x726564;
      local_530.m_name._M_dataplus._M_p = (pointer)paVar2;
      tcu::LogSection::LogSection((LogSection *)local_448,&local_618.m_name,&local_530.m_name);
      tcu::TestLog::startSection((TestLog *)TVar4,(char *)local_448,(char *)local_428._0_8_);
      if ((pointer)local_428._0_8_ != (pointer)(local_428 + 0x10)) {
        operator_delete((void *)local_428._0_8_,(ulong)(local_428._16_8_ + 1));
      }
      if (local_448 != (undefined1  [8])((long)auStack_440 + 8)) {
        operator_delete((void *)local_448,auStack_440._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530.m_name._M_dataplus._M_p != paVar2) {
        operator_delete(local_530.m_name._M_dataplus._M_p,
                        CONCAT35(local_530.m_name.field_2._M_allocated_capacity._5_3_,
                                 local_530.m_name.field_2._M_allocated_capacity._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618.m_name._M_dataplus._M_p != &local_618.m_name.field_2) {
        operator_delete(local_618.m_name._M_dataplus._M_p,
                        CONCAT35(local_618.m_name.field_2._M_allocated_capacity._5_3_,
                                 local_618.m_name.field_2._M_allocated_capacity._0_5_) + 1);
      }
      glu::operator<<((TestLog *)TVar4,&pRVar10->m_program);
      tcu::TestLog::endSection((TestLog *)TVar4);
      local_618.m_name._M_dataplus._M_p = (pointer)&local_618.m_name.field_2;
      local_618.m_name.field_2._M_allocated_capacity._0_5_ = 0x756c63634f;
      local_618.m_name._M_string_length = 8;
      local_618.m_name.field_2._5_4_ = 0x646564;
      local_530.m_name.field_2._M_allocated_capacity._0_5_ = 0x756c63634f;
      local_530.m_name._M_string_length = 8;
      local_530.m_name.field_2._5_4_ = 0x646564;
      local_530.m_name._M_dataplus._M_p = (pointer)paVar2;
      tcu::LogSection::LogSection((LogSection *)local_448,&local_618.m_name,&local_530.m_name);
      tcu::TestLog::startSection((TestLog *)TVar4,(char *)local_448,(char *)local_428._0_8_);
      if ((pointer)local_428._0_8_ != (pointer)(local_428 + 0x10)) {
        operator_delete((void *)local_428._0_8_,(ulong)(local_428._16_8_ + 1));
      }
      if (local_448 != (undefined1  [8])((long)auStack_440 + 8)) {
        operator_delete((void *)local_448,auStack_440._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530.m_name._M_dataplus._M_p != paVar2) {
        operator_delete(local_530.m_name._M_dataplus._M_p,
                        CONCAT35(local_530.m_name.field_2._M_allocated_capacity._5_3_,
                                 local_530.m_name.field_2._M_allocated_capacity._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618.m_name._M_dataplus._M_p != &local_618.m_name.field_2) {
        operator_delete(local_618.m_name._M_dataplus._M_p,
                        CONCAT35(local_618.m_name.field_2._M_allocated_capacity._5_3_,
                                 local_618.m_name.field_2._M_allocated_capacity._0_5_) + 1);
      }
      glu::operator<<((TestLog *)TVar4,&local_640->m_program);
      tcu::TestLog::endSection((TestLog *)TVar4);
      std::vector<int,_std::allocator<int>_>::reserve(&local_638,0xa0);
      iVar8 = 0;
      do {
        local_448._0_4_ = (iVar8 * iVar5) / 10;
        iVar18 = 0x10;
        do {
          if (local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_638,
                       (iterator)
                       local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_448);
          }
          else {
            *local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = local_448._0_4_;
            local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
        iVar8 = iVar8 + 1;
      } while (iVar8 != 10);
      de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((Random *)&local_40,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_640 = local_458.m_data.ptr;
        local_1e0 = local_4c8.m_data.ptr;
        uVar19 = 0;
        do {
          CVar3 = local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar19];
          (*(this->super_TestCase).super_TestNode._vptr_TestNode[10])
                    (local_448,this,local_640,local_1e0);
          pTVar14 = local_658;
          CStack_42c = CVar3;
          CStack_430 = (ChannelOrder)uVar19;
          if (pTStack_650 == local_648) {
            __n = (long)pTStack_650 - (long)local_658;
            if (__n == 0x7fffffffffffffe0) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar16 = (long)__n >> 5;
            uVar11 = uVar16;
            if (pTStack_650 == local_658) {
              uVar11 = 1;
            }
            uVar20 = uVar11 + uVar16;
            if (0x3fffffffffffffe < uVar20) {
              uVar20 = 0x3ffffffffffffff;
            }
            if (CARRY8(uVar11,uVar16)) {
              uVar20 = 0x3ffffffffffffff;
            }
            if (uVar20 == 0) {
              pTVar12 = (TextureFormat *)0x0;
            }
            else {
              pTVar12 = (TextureFormat *)operator_new(uVar20 << 5);
            }
            pTVar1 = pTVar12 + uVar16 * 4 + 2;
            pTVar1->order = auStack_440._8_4_;
            pTVar1->type = auStack_440._12_4_;
            pTVar1[1].order = CStack_430;
            pTVar1[1].type = CStack_42c;
            pTVar1 = pTVar12 + uVar16 * 4;
            pTVar1->order = local_448._0_4_;
            pTVar1->type = local_448._4_4_;
            pTVar1[1].order = auStack_440._0_4_;
            pTVar1[1].type = auStack_440._4_4_;
            if (0 < (long)__n) {
              memmove(pTVar12,pTVar14,__n);
            }
            if (pTVar14 != (TextureFormat *)0x0) {
              operator_delete(pTVar14,(long)local_648 - (long)pTVar14);
            }
            pTStack_650 = (TextureFormat *)((long)pTVar12 + __n);
            local_648 = pTVar12 + uVar20 * 4;
            local_658 = pTVar12;
          }
          else {
            pTStack_650[2].order = auStack_440._8_4_;
            pTStack_650[2].type = auStack_440._12_4_;
            pTStack_650[3].order = (ChannelOrder)uVar19;
            pTStack_650[3].type = CVar3;
            pTStack_650->order = local_448._0_4_;
            pTStack_650->type = local_448._4_4_;
            pTStack_650[1].order = auStack_440._0_4_;
            pTStack_650[1].type = auStack_440._4_4_;
          }
          pTStack_650 = pTStack_650 + 4;
          uVar19 = uVar19 + 1;
        } while (uVar19 < (ulong)((long)local_638.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_638.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Samples","");
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"Samples","");
      bVar21 = (long)pTStack_650 - (long)local_658 != 0;
      if (bVar21) {
        uVar19 = (long)pTStack_650 - (long)local_658 >> 5;
        bVar21 = true;
        if ((local_658[1] == (TextureFormat)0x0) && (*local_658 == (TextureFormat)0x0)) {
          pTVar14 = local_658 + 5;
          uVar11 = 1;
          do {
            uVar16 = uVar11;
            if ((uVar19 + (uVar19 == 0) == uVar16) || (*pTVar14 != (TextureFormat)0x0)) break;
            pTVar12 = pTVar14 + -1;
            pTVar14 = pTVar14 + 4;
            uVar11 = uVar16 + 1;
          } while (*pTVar12 == (TextureFormat)0x0);
          bVar21 = uVar16 < uVar19;
        }
      }
      TVar4 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      tcu::LogSampleList::LogSampleList((LogSampleList *)local_448,&local_2a8,&local_2c8);
      tcu::TestLog::startSampleList((TestLog *)TVar4,(string *)local_448,(string *)local_428);
      if ((pointer)local_428._0_8_ != (pointer)(local_428 + 0x10)) {
        operator_delete((void *)local_428._0_8_,(ulong)(local_428._16_8_ + 1));
      }
      if (local_448 != (undefined1  [8])((long)auStack_440 + 8)) {
        operator_delete((void *)local_448,auStack_440._8_8_ + 1);
      }
      if (bVar21) {
        tcu::TestLog::startSampleInfo((TestLog *)TVar4);
        local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
        local_590.field_2._M_allocated_capacity = 0x64616f6c6b726f57;
        local_590._M_string_length = 8;
        local_590.field_2._M_local_buf[8] = '\0';
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        local_478.field_2._M_allocated_capacity = 0x64616f6c6b726f57;
        local_478._M_string_length = 8;
        local_478.field_2._M_local_buf[8] = '\0';
        local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        local_498._M_string_length = 0;
        local_498.field_2._M_local_buf[0] = '\0';
        tcu::LogValueInfo::LogValueInfo
                  ((LogValueInfo *)local_448,&local_590,&local_478,&local_498,
                   QP_SAMPLE_VALUE_TAG_PREDICTOR);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)TVar4,(string *)local_448,(string *)local_428,(string *)&local_408,
                   local_3e8);
        local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
        local_5b0.field_2._M_allocated_capacity._0_4_ = 0x6564724f;
        local_5b0.field_2._M_allocated_capacity._4_2_ = 0x72;
        local_5b0._M_string_length = 5;
        local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
        local_4b8.field_2._M_allocated_capacity._0_7_ = 0x6f20726564724f;
        local_4b8.field_2._M_local_buf[7] = 'f';
        local_4b8.field_2._M_local_buf[8] = ' ';
        local_4b8.field_2._9_6_ = 0x656c706d6173;
        local_4b8._M_string_length = 0xf;
        local_4b8.field_2._M_local_buf[0xf] = '\0';
        local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
        local_550._M_string_length = 0;
        local_550.field_2._M_allocated_capacity =
             local_550.field_2._M_allocated_capacity & 0xffffffffffffff00;
        tcu::LogValueInfo::LogValueInfo
                  (&local_248,&local_5b0,&local_4b8,&local_550,QP_SAMPLE_VALUE_TAG_PREDICTOR);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)TVar4,&local_248.m_name,&local_248.m_description,&local_248.m_unit,
                   local_248.m_tag);
        local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
        local_570.field_2._M_allocated_capacity = 0x656d695474736554;
        local_570._M_string_length = 8;
        local_570.field_2._M_local_buf[8] = '\0';
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        local_530.m_name._M_dataplus._M_p = (pointer)0x10;
        local_268._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_268,(ulong)&local_530);
        local_268.field_2._M_allocated_capacity = (size_type)local_530.m_name._M_dataplus._M_p;
        builtin_strncpy(local_268._M_dataplus._M_p,"Test render time",0x10);
        local_268._M_string_length = (size_type)local_530.m_name._M_dataplus._M_p;
        local_268._M_dataplus._M_p[(long)local_530.m_name._M_dataplus._M_p] = '\0';
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        local_1d8.field_2._M_allocated_capacity._0_2_ = 0x7375;
        local_1d8._M_string_length = 2;
        local_1d8.field_2._M_local_buf[2] = '\0';
        tcu::LogValueInfo::LogValueInfo
                  (&local_618,&local_570,&local_268,&local_1d8,QP_SAMPLE_VALUE_TAG_RESPONSE);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)TVar4,&local_618.m_name,&local_618.m_description,&local_618.m_unit,
                   local_618.m_tag);
        local_a0.field_2._M_allocated_capacity = 0x656d69546c6c754e;
        local_a0._M_string_length = 8;
        local_a0.field_2._M_local_buf[8] = '\0';
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        local_148.m_name._M_dataplus._M_p = (pointer)0x10;
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        local_288._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_288,(ulong)&local_148);
        local_288.field_2._M_allocated_capacity = (size_type)local_148.m_name._M_dataplus._M_p;
        builtin_strncpy(local_288._M_dataplus._M_p,"Read pixels time",0x10);
        local_288._M_string_length = (size_type)local_148.m_name._M_dataplus._M_p;
        local_288._M_dataplus._M_p[(long)local_148.m_name._M_dataplus._M_p] = '\0';
        local_c0.field_2._M_allocated_capacity._0_2_ = 0x7375;
        local_c0._M_string_length = 2;
        local_c0.field_2._M_local_buf[2] = '\0';
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        tcu::LogValueInfo::LogValueInfo
                  (&local_530,&local_a0,&local_288,&local_c0,QP_SAMPLE_VALUE_TAG_RESPONSE);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)TVar4,&local_530.m_name,&local_530.m_description,&local_530.m_unit,
                   local_530.m_tag);
        local_e0.field_2._M_allocated_capacity = 0x656d695465736142;
        local_e0._M_string_length = 8;
        local_e0.field_2._M_local_buf[8] = '\0';
        local_1b8._M_dataplus._M_p = (pointer)0x10;
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        local_198._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_198,(ulong)&local_1b8);
        local_198.field_2._M_allocated_capacity = (size_type)local_1b8._M_dataplus._M_p;
        builtin_strncpy(local_198._M_dataplus._M_p,"Base render time",0x10);
        local_198._M_string_length = (size_type)local_1b8._M_dataplus._M_p;
        local_198._M_dataplus._M_p[(long)local_1b8._M_dataplus._M_p] = '\0';
        local_1b8.field_2._M_allocated_capacity._0_2_ = 0x7375;
        local_1b8._M_string_length = 2;
        local_1b8.field_2._M_local_buf[2] = '\0';
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        tcu::LogValueInfo::LogValueInfo
                  (&local_148,&local_e0,&local_198,&local_1b8,QP_SAMPLE_VALUE_TAG_RESPONSE);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)TVar4,&local_148.m_name,&local_148.m_description,&local_148.m_unit,
                   local_148.m_tag);
        tcu::TestLog::endSampleInfo((TestLog *)TVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148.m_unit._M_dataplus._M_p != &local_148.m_unit.field_2) {
          operator_delete(local_148.m_unit._M_dataplus._M_p,
                          local_148.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148.m_description._M_dataplus._M_p != &local_148.m_description.field_2) {
          operator_delete(local_148.m_description._M_dataplus._M_p,
                          local_148.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148.m_name._M_dataplus._M_p != &local_148.m_name.field_2) {
          operator_delete(local_148.m_name._M_dataplus._M_p,
                          local_148.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,
                          CONCAT53(local_1b8.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(local_1b8.field_2._M_local_buf[2],
                                            local_1b8.field_2._M_allocated_capacity._0_2_)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,
                          (ulong)(local_198.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530.m_unit._M_dataplus._M_p != &local_530.m_unit.field_2) {
          operator_delete(local_530.m_unit._M_dataplus._M_p,
                          local_530.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530.m_description._M_dataplus._M_p != &local_530.m_description.field_2) {
          operator_delete(local_530.m_description._M_dataplus._M_p,
                          local_530.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530.m_name._M_dataplus._M_p != &local_530.m_name.field_2) {
          operator_delete(local_530.m_name._M_dataplus._M_p,
                          CONCAT35(local_530.m_name.field_2._M_allocated_capacity._5_3_,
                                   local_530.m_name.field_2._M_allocated_capacity._0_5_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,
                          CONCAT53(local_c0.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(local_c0.field_2._M_local_buf[2],
                                            local_c0.field_2._M_allocated_capacity._0_2_)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          (ulong)(local_288.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618.m_unit._M_dataplus._M_p != &local_618.m_unit.field_2) {
          operator_delete(local_618.m_unit._M_dataplus._M_p,
                          local_618.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618.m_description._M_dataplus._M_p != &local_618.m_description.field_2) {
          operator_delete(local_618.m_description._M_dataplus._M_p,
                          local_618.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618.m_name._M_dataplus._M_p != &local_618.m_name.field_2) {
          operator_delete(local_618.m_name._M_dataplus._M_p,
                          CONCAT35(local_618.m_name.field_2._M_allocated_capacity._5_3_,
                                   local_618.m_name.field_2._M_allocated_capacity._0_5_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,
                          CONCAT53(local_1d8.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(local_1d8.field_2._M_local_buf[2],
                                            local_1d8.field_2._M_allocated_capacity._0_2_)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,
                          (ulong)(local_268.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570._M_dataplus._M_p != &local_570.field_2) {
          operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248.m_unit._M_dataplus._M_p != &local_248.m_unit.field_2) {
          operator_delete(local_248.m_unit._M_dataplus._M_p,
                          local_248.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248.m_description._M_dataplus._M_p != &local_248.m_description.field_2) {
          operator_delete(local_248.m_description._M_dataplus._M_p,
                          local_248.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248.m_name._M_dataplus._M_p != &local_248.m_name.field_2) {
          operator_delete(local_248.m_name._M_dataplus._M_p,
                          local_248.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
          operator_delete(local_4b8._M_dataplus._M_p,
                          CONCAT17(local_4b8.field_2._M_local_buf[7],
                                   local_4b8.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
          operator_delete(local_5b0._M_dataplus._M_p,
                          CONCAT26(local_5b0.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_5b0.field_2._M_allocated_capacity._4_2_,
                                            local_5b0.field_2._M_allocated_capacity._0_4_)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_allocated_capacity != &local_3f8) {
          operator_delete((void *)local_408._M_allocated_capacity,
                          (ulong)(local_3f8._M_allocated_capacity + 1));
        }
        if ((pointer)local_428._0_8_ != (pointer)(local_428 + 0x10)) {
          operator_delete((void *)local_428._0_8_,(ulong)(local_428._16_8_ + 1));
        }
        if (local_448 != (undefined1  [8])((long)auStack_440 + 8)) {
          operator_delete((void *)local_448,auStack_440._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p,
                          CONCAT17(local_498.field_2._M_local_buf[7],
                                   CONCAT61(local_498.field_2._M_allocated_capacity._1_6_,
                                            local_498.field_2._M_local_buf[0])) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != &local_590.field_2) {
          operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
        }
        if (pTStack_650 != local_658) {
          lVar15 = 0x1c;
          uVar19 = 0;
          do {
            pTVar14 = local_658;
            auStack_440._0_4_ = R;
            auStack_440._4_4_ = SNORM_INT8;
            auStack_440._8_4_ = R;
            auStack_440._12_4_ = SNORM_INT8;
            CStack_430 = R;
            CStack_42c = SNORM_INT8;
            local_448 = (undefined1  [8])TVar4;
            pSVar13 = tcu::SampleBuilder::operator<<
                                ((SampleBuilder *)local_448,
                                 *(int *)((long)&local_658->order + lVar15));
            pSVar13 = tcu::SampleBuilder::operator<<(pSVar13,*(int *)((long)pTVar14 + lVar15 + -4));
            pSVar13 = tcu::SampleBuilder::operator<<
                                (pSVar13,*(deInt64 *)((long)pTVar14 + lVar15 + -0xc));
            pSVar13 = tcu::SampleBuilder::operator<<
                                (pSVar13,*(deInt64 *)((long)pTVar14 + lVar15 + -0x1c));
            pSVar13 = tcu::SampleBuilder::operator<<
                                (pSVar13,*(deInt64 *)((long)pTVar14 + lVar15 + -0x14));
            tcu::SampleBuilder::operator<<(pSVar13,(EndSampleToken *)&tcu::TestLog::EndSample);
            if ((TextureFormat)auStack_440._0_8_ != (TextureFormat)0x0) {
              operator_delete((void *)auStack_440._0_8_,_CStack_430 - auStack_440._0_8_);
            }
            uVar19 = uVar19 + 1;
            lVar15 = lVar15 + 0x20;
          } while (uVar19 < (ulong)((long)pTStack_650 - (long)local_658 >> 5));
        }
      }
      else {
        tcu::TestLog::startSampleInfo((TestLog *)TVar4);
        local_530.m_name._M_dataplus._M_p = (pointer)&local_530.m_name.field_2;
        local_530.m_name.field_2._M_allocated_capacity._0_5_ = 0x6c6b726f57;
        local_530.m_name._M_string_length = 8;
        local_530.m_name.field_2._5_4_ = 0x64616f;
        local_148.m_name._M_dataplus._M_p = (pointer)&local_148.m_name.field_2;
        local_148.m_name.field_2._M_allocated_capacity = 0x64616f6c6b726f57;
        local_148.m_name._M_string_length = 8;
        local_148.m_name.field_2._M_local_buf[8] = '\0';
        local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
        local_590._M_string_length = 0;
        local_590.field_2._M_allocated_capacity =
             local_590.field_2._M_allocated_capacity & 0xffffffffffffff00;
        tcu::LogValueInfo::LogValueInfo
                  ((LogValueInfo *)local_448,&local_530.m_name,&local_148.m_name,&local_590,
                   QP_SAMPLE_VALUE_TAG_PREDICTOR);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)TVar4,(string *)local_448,(string *)local_428,(string *)&local_408,
                   local_3e8);
        local_478.field_2._M_allocated_capacity._0_6_ = 0x726564724f;
        local_478._M_string_length = 5;
        local_498.field_2._M_local_buf[0] = 'O';
        local_498.field_2._M_allocated_capacity._1_6_ = 0x6f2072656472;
        local_498.field_2._M_local_buf[7] = 'f';
        local_498.field_2._8_7_ = 0x656c706d617320;
        local_498._M_string_length = 0xf;
        local_498.field_2._M_local_buf[0xf] = '\0';
        local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
        local_5b0._M_string_length = 0;
        local_5b0.field_2._M_allocated_capacity._0_4_ =
             local_5b0.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        tcu::LogValueInfo::LogValueInfo
                  (&local_248,&local_478,&local_498,&local_5b0,QP_SAMPLE_VALUE_TAG_PREDICTOR);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)TVar4,&local_248.m_name,&local_248.m_description,&local_248.m_unit,
                   local_248.m_tag);
        local_4b8.field_2._M_allocated_capacity._0_7_ = 0x6d695474736554;
        local_4b8.field_2._M_local_buf[7] = 'e';
        local_4b8._M_string_length = 8;
        local_4b8.field_2._M_local_buf[8] = '\0';
        local_570._M_dataplus._M_p = (pointer)0x10;
        local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
        local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
        local_550._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_550,(ulong)&local_570);
        local_550.field_2._M_allocated_capacity = (size_type)local_570._M_dataplus._M_p;
        *(undefined8 *)local_550._M_dataplus._M_p = 0x6e65722074736554;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_550._M_dataplus._M_p + 8) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_550._M_dataplus._M_p + 9) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_550._M_dataplus._M_p + 10) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_550._M_dataplus._M_p + 0xb) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_550._M_dataplus._M_p + 0xc) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_550._M_dataplus._M_p + 0xd) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_550._M_dataplus._M_p + 0xe) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_550._M_dataplus._M_p + 0xf) = 'e';
        local_550._M_string_length = (size_type)local_570._M_dataplus._M_p;
        local_550._M_dataplus._M_p[(long)local_570._M_dataplus._M_p] = '\0';
        local_570._M_string_length = 2;
        local_570.field_2._M_allocated_capacity._0_3_ = 0x7375;
        local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
        tcu::LogValueInfo::LogValueInfo
                  (&local_618,&local_4b8,&local_550,&local_570,QP_SAMPLE_VALUE_TAG_RESPONSE);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)TVar4,&local_618.m_name,&local_618.m_description,&local_618.m_unit,
                   local_618.m_tag);
        tcu::TestLog::endSampleInfo((TestLog *)TVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618.m_unit._M_dataplus._M_p != &local_618.m_unit.field_2) {
          operator_delete(local_618.m_unit._M_dataplus._M_p,
                          local_618.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618.m_description._M_dataplus._M_p != &local_618.m_description.field_2) {
          operator_delete(local_618.m_description._M_dataplus._M_p,
                          local_618.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618.m_name._M_dataplus._M_p != &local_618.m_name.field_2) {
          operator_delete(local_618.m_name._M_dataplus._M_p,
                          CONCAT35(local_618.m_name.field_2._M_allocated_capacity._5_3_,
                                   local_618.m_name.field_2._M_allocated_capacity._0_5_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570._M_dataplus._M_p != &local_570.field_2) {
          operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
          operator_delete(local_4b8._M_dataplus._M_p,
                          CONCAT17(local_4b8.field_2._M_local_buf[7],
                                   local_4b8.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248.m_unit._M_dataplus._M_p != &local_248.m_unit.field_2) {
          operator_delete(local_248.m_unit._M_dataplus._M_p,
                          local_248.m_unit.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248.m_description._M_dataplus._M_p != &local_248.m_description.field_2) {
          operator_delete(local_248.m_description._M_dataplus._M_p,
                          local_248.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248.m_name._M_dataplus._M_p != &local_248.m_name.field_2) {
          operator_delete(local_248.m_name._M_dataplus._M_p,
                          local_248.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
          operator_delete(local_5b0._M_dataplus._M_p,
                          CONCAT26(local_5b0.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_5b0.field_2._M_allocated_capacity._4_2_,
                                            local_5b0.field_2._M_allocated_capacity._0_4_)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p,
                          CONCAT17(local_498.field_2._M_local_buf[7],
                                   CONCAT61(local_498.field_2._M_allocated_capacity._1_6_,
                                            local_498.field_2._M_local_buf[0])) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_allocated_capacity != &local_3f8) {
          operator_delete((void *)local_408._M_allocated_capacity,
                          (ulong)(local_3f8._M_allocated_capacity + 1));
        }
        if ((pointer)local_428._0_8_ != (pointer)(local_428 + 0x10)) {
          operator_delete((void *)local_428._0_8_,(ulong)(local_428._16_8_ + 1));
        }
        if (local_448 != (undefined1  [8])((long)auStack_440 + 8)) {
          operator_delete((void *)local_448,auStack_440._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != &local_590.field_2) {
          operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148.m_name._M_dataplus._M_p != &local_148.m_name.field_2) {
          operator_delete(local_148.m_name._M_dataplus._M_p,
                          local_148.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530.m_name._M_dataplus._M_p != &local_530.m_name.field_2) {
          operator_delete(local_530.m_name._M_dataplus._M_p,
                          CONCAT35(local_530.m_name.field_2._M_allocated_capacity._5_3_,
                                   local_530.m_name.field_2._M_allocated_capacity._0_5_) + 1);
        }
        if (pTStack_650 != local_658) {
          lVar15 = 0x1c;
          uVar19 = 0;
          do {
            pTVar14 = local_658;
            auStack_440._0_4_ = R;
            auStack_440._4_4_ = SNORM_INT8;
            auStack_440._8_4_ = R;
            auStack_440._12_4_ = SNORM_INT8;
            CStack_430 = R;
            CStack_42c = SNORM_INT8;
            local_448 = (undefined1  [8])TVar4;
            pSVar13 = tcu::SampleBuilder::operator<<
                                ((SampleBuilder *)local_448,
                                 *(int *)((long)&local_658->order + lVar15));
            pSVar13 = tcu::SampleBuilder::operator<<(pSVar13,*(int *)((long)pTVar14 + lVar15 + -4));
            pSVar13 = tcu::SampleBuilder::operator<<
                                (pSVar13,*(deInt64 *)((long)pTVar14 + lVar15 + -0xc));
            tcu::SampleBuilder::operator<<(pSVar13,(EndSampleToken *)&tcu::TestLog::EndSample);
            if ((TextureFormat)auStack_440._0_8_ != (TextureFormat)0x0) {
              operator_delete((void *)auStack_440._0_8_,_CStack_430 - auStack_440._0_8_);
            }
            uVar19 = uVar19 + 1;
            lVar15 = lVar15 + 0x20;
          } while (uVar19 < (ulong)((long)pTStack_650 - (long)local_658 >> 5));
        }
      }
      tcu::TestLog::endSampleList((TestLog *)TVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,&local_658);
      tcu::ResultCollector::setTestContextResult
                (&this->m_results,(this->super_TestCase).super_TestNode.m_testCtx);
      tcu::TextureLevel::~TextureLevel(&local_68);
      de::details::
      UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
      ::reset(&local_4c8);
      de::details::
      UniqueBase<deqp::gles3::Performance::(anonymous_namespace)::RenderData,_de::DefaultDeleter<deqp::gles3::Performance::(anonymous_namespace)::RenderData>_>
      ::reset(&local_458);
      if (local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_638.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_658 != (TextureFormat *)0x0) {
        operator_delete(local_658,(long)local_648 - (long)local_658);
      }
      glu::ObjectWrapper::~ObjectWrapper(&local_178);
      glu::ObjectWrapper::~ObjectWrapper(&local_160);
      glu::ObjectWrapper::~ObjectWrapper(&local_80);
      return STOP;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"occludedData->m_program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pDepthTests.cpp"
               ,0x244);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

BaseCase::IterateResult BaseCase::iterate (void)
{
	typedef de::MovePtr<RenderData> RenderDataP;

	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();

	const glu::Framebuffer	framebuffer			(gl);
	const glu::Renderbuffer	renderbuffer		(gl);
	const glu::Renderbuffer	depthbuffer			(gl);

	vector<Sample>			results;
	vector<int>				params;
	RenderDataP				occluderData;
	RenderDataP				occludedData;
	tcu::TextureLevel		resultTex			(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), RENDER_SIZE, RENDER_SIZE);
	int						maxWorkload			= 0;
	de::Random				rng					(deInt32Hash(deStringHash(getName())) ^ m_testCtx.getCommandLine().getBaseSeed());

	logDescription();

	gl.bindRenderbuffer(GL_RENDERBUFFER, *renderbuffer);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, RENDER_SIZE, RENDER_SIZE);
	gl.bindRenderbuffer(GL_RENDERBUFFER, *depthbuffer);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_DEPTH24_STENCIL8, RENDER_SIZE, RENDER_SIZE);

	gl.bindFramebuffer(GL_FRAMEBUFFER, *framebuffer);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *renderbuffer);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, *depthbuffer);
	gl.viewport(0, 0, RENDER_SIZE, RENDER_SIZE);
	gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);

	maxWorkload = calibrate();

	// Setup data
	occluderData = RenderDataP(new RenderData (genOccluderGeometry(), m_renderCtx, log));
	occludedData = RenderDataP(new RenderData (genOccludedGeometry(), m_renderCtx, log));

	TCU_CHECK(occluderData->m_program.isOk());
	TCU_CHECK(occludedData->m_program.isOk());

	// Force initialization of GPU resources
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);

	render(*occluderData);
	render(*occludedData);
	glu::readPixels(m_renderCtx, 0, 0, resultTex.getAccess());

	logGeometry(resultTex.getAccess(), occluderData->m_program, occludedData->m_program);

	params.reserve(ITERATION_STEPS*ITERATION_SAMPLES);

	// Setup parameters
	for (int step = 0; step < ITERATION_STEPS; step++)
	{
		const int workload = maxWorkload*step/ITERATION_STEPS;

		for (int count = 0; count < ITERATION_SAMPLES; count++)
			params.push_back(workload);
	}

	rng.shuffle(params.begin(), params.end());

	// Render samples
	for (size_t ndx = 0; ndx < params.size(); ndx++)
	{
		const int	workload	= params[ndx];
		Sample		sample		= renderSample(*occluderData, *occludedData, workload);

		sample.workload = workload;
		sample.order = int(ndx);

		results.push_back(sample);
	}

	logSamples(results, "Samples", "Samples");
	logAnalysis(results);

	m_results.setTestContextResult(m_testCtx);

	return STOP;
}